

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

TimerTickResult __thiscall tonk::Connection::onTimerTick(Connection *this)

{
  bool bVar1;
  __int_type_conflict3 _Var2;
  uint uVar3;
  uint64_t uVar4;
  void *pvVar5;
  char *pcVar6;
  long in_RDI;
  Result result_1;
  Result result;
  uint i_1;
  int recoveryBytesSent;
  uint recoveryCount;
  Result flushResult;
  Result retransmitResult;
  bool messageSent;
  uint i;
  Result flushResult_1;
  uint16_t externalMappedPort;
  uint64_t nowUsec;
  uint64_t nowUsec_1;
  int in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  uint in_stack_fffffffffffffdb4;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffdb8;
  undefined2 in_stack_fffffffffffffdbc;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  undefined4 in_stack_fffffffffffffdc0;
  MessageType in_stack_fffffffffffffdc4;
  SessionOutgoing *in_stack_fffffffffffffdc8;
  SenderBandwidthControl *in_stack_fffffffffffffdd0;
  ErrorResult *this_00;
  uint64_t in_stack_fffffffffffffde0;
  Connection *in_stack_fffffffffffffde8;
  allocator *result_00;
  uint in_stack_fffffffffffffdf4;
  RefCounter *in_stack_fffffffffffffdf8;
  Connection *in_stack_fffffffffffffe18;
  undefined6 local_1d0;
  uint16_t in_stack_fffffffffffffe36;
  Connection *in_stack_fffffffffffffe38;
  long local_1b0;
  int local_1a4;
  long local_1a0;
  uint local_194;
  long local_190;
  allocator local_179;
  bool *in_stack_fffffffffffffe88;
  SessionOutgoing *in_stack_fffffffffffffe90;
  undefined1 local_158 [31];
  undefined1 local_139 [25];
  SessionOutgoing *in_stack_fffffffffffffee0;
  void *local_118;
  uint64_t local_110;
  undefined4 local_100;
  undefined8 local_f0;
  undefined4 local_e4;
  undefined1 *local_e0;
  char *local_d8;
  void **local_d0;
  undefined8 local_b8;
  undefined4 local_ac;
  undefined1 *local_a8;
  SessionOutgoing *in_stack_ffffffffffffff60;
  SessionOutgoing *in_stack_ffffffffffffff68;
  
  uVar4 = siamese::GetTimeUsec();
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             CONCAT17(in_stack_fffffffffffffdbf,
                      CONCAT16(in_stack_fffffffffffffdbe,
                               CONCAT24(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8))));
  local_110 = uVar4;
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)
                     CONCAT17(in_stack_fffffffffffffdbf,
                              CONCAT16(in_stack_fffffffffffffdbe,
                                       CONCAT24(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)
                                      )));
  if (bVar1) {
    in_stack_fffffffffffffe18 = (Connection *)local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_139 + 1),"App shutdown in progress",
               (allocator *)in_stack_fffffffffffffe18);
    local_d0 = &local_118;
    local_d8 = "Connection::onTimerTick";
    local_e0 = local_139 + 1;
    local_e4 = 0;
    local_f0 = 0xc;
    pvVar5 = operator_new(0x38);
    ErrorResult::ErrorResult
              ((ErrorResult *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
               (string *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               CONCAT13(in_stack_fffffffffffffdbf,
                        CONCAT12(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdbc)),
               CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    local_118 = pvVar5;
    RefCounter::StartShutdown
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
               (Result *)in_stack_fffffffffffffde8);
    Result::~Result((Result *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    std::__cxx11::string::~string((string *)(local_139 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_139);
  }
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)
                     CONCAT17(in_stack_fffffffffffffdbf,
                              CONCAT16(in_stack_fffffffffffffdbe,
                                       CONCAT24(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)
                                      )));
  if (bVar1) {
    local_100 = onDiscoTimerTick((Connection *)
                                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  }
  else {
    bVar1 = Timer::IsExpired((Timer *)(in_RDI + 0xc7e8),local_110);
    if (bVar1) {
      result_00 = &local_179;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffe88,"No data from peer (Connection timeout)",
                 result_00);
      this_00 = (ErrorResult *)local_158;
      local_a8 = &stack0xfffffffffffffe88;
      local_ac = 0;
      local_b8 = 2;
      pcVar6 = (char *)operator_new(0x38);
      ErrorResult::ErrorResult
                (this_00,(char *)in_stack_fffffffffffffdc8,
                 (string *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 CONCAT13(in_stack_fffffffffffffdbf,
                          CONCAT12(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdbc)),
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      this_00->Source = pcVar6;
      RefCounter::StartShutdown
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,(Result *)result_00);
      Result::~Result((Result *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      local_100 = TickAgain;
    }
    else {
      if ((((*(int *)(in_RDI + 0x468) != *(int *)(in_RDI + 0x470)) &&
           (*(long *)(in_RDI + 0x458) != 0)) &&
          (0 < (long)((local_110 - *(long *)(in_RDI + 0x458)) + -300000))) &&
         (SenderBandwidthControl::Squelch((SenderBandwidthControl *)(in_RDI + 0xc5f8)),
         *(int *)(in_RDI + 0xc904) != 0x7fffffff)) {
        SessionOutgoing::StartHandshakeC2SUpdateSourceAddress
                  ((SessionOutgoing *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   CONCAT17(in_stack_fffffffffffffdbf,
                            CONCAT16(in_stack_fffffffffffffdbe,
                                     CONCAT24(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)))
                   ,in_stack_fffffffffffffdb4);
      }
      SenderBandwidthControl::RecalculateAvailableBytes
                (in_stack_fffffffffffffdd0,(uint64_t)in_stack_fffffffffffffdc8);
      ReceiverBandwidthControl::UpdateSendShape
                ((ReceiverBandwidthControl *)
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 CONCAT17(in_stack_fffffffffffffdbf,
                          CONCAT16(in_stack_fffffffffffffdbe,
                                   CONCAT24(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8))),
                 in_stack_fffffffffffffdb4);
      if ((*(long *)(in_RDI + 0x98) != 0) &&
         (_Var2 = std::__atomic_base::operator_cast_to_unsigned_short
                            ((__atomic_base<unsigned_short> *)
                             CONCAT17(in_stack_fffffffffffffdbf,
                                      CONCAT16(in_stack_fffffffffffffdbe,
                                               CONCAT24(in_stack_fffffffffffffdbc,
                                                        in_stack_fffffffffffffdb8)))),
         *(__int_type_conflict3 *)(in_RDI + 0xc908) != _Var2)) {
        *(__int_type_conflict3 *)(in_RDI + 0xc908) = _Var2;
        sendNATMapPortToPeer(in_stack_fffffffffffffe38,in_stack_fffffffffffffe36);
      }
      bVar1 = std::atomic::operator_cast_to_bool
                        ((atomic<bool> *)
                         CONCAT17(in_stack_fffffffffffffdbf,
                                  CONCAT16(in_stack_fffffffffffffdbe,
                                           CONCAT24(in_stack_fffffffffffffdbc,
                                                    in_stack_fffffffffffffdb8))));
      if (bVar1) {
        for (local_194 = 0; local_194 < 10; local_194 = local_194 + 1) {
          SessionOutgoing::PostRetransmit(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          if (local_1a0 == 0) {
            local_1a4 = 2;
          }
          else {
            RefCounter::StartShutdown
                      (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                       (Result *)in_stack_fffffffffffffde8);
            local_100 = TickAgain;
            local_1a4 = 1;
          }
          Result::~Result((Result *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
          if (local_1a4 != 0) {
            if (local_1a4 == 1) {
              return local_100;
            }
            break;
          }
        }
        bVar1 = Timer::IsExpired((Timer *)(in_RDI + 0xc808),local_110);
        if (bVar1) {
          onTimeSyncSendTimer(in_stack_fffffffffffffe18);
        }
        bVar1 = Timer::IsExpired((Timer *)(in_RDI + 0xc828),local_110);
        if ((bVar1) || ((*(byte *)(in_RDI + 0xc700) & 1) != 0)) {
          onAckSendTimer(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        }
        bVar1 = Timer::IsExpired((Timer *)(in_RDI + 0xc848),local_110);
        if (bVar1) {
          (**(code **)(in_RDI + 0x100))(*(undefined8 *)(in_RDI + 0xe8),in_RDI,local_110);
        }
        SessionOutgoing::Flush(in_stack_ffffffffffffff60);
        uVar7 = CONCAT13(local_1b0 != 0,(int3)in_stack_fffffffffffffdb4);
        if (local_1b0 != 0) {
          RefCounter::StartShutdown
                    (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                     (Result *)in_stack_fffffffffffffde8);
        }
        uVar3 = SenderBandwidthControl::CalculateRecoverySendCount
                          ((SenderBandwidthControl *)in_stack_fffffffffffffdc8,
                           CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
        if (uVar3 != 0) {
          SessionOutgoing::PostRecovery(in_stack_ffffffffffffff68,(int *)in_stack_ffffffffffffff60);
          in_stack_fffffffffffffdac =
               CONCAT13(in_stack_fffffffffffffe38 != (Connection *)0x0,
                        (int3)in_stack_fffffffffffffdac);
          if (in_stack_fffffffffffffe38 != (Connection *)0x0) {
            RefCounter::StartShutdown
                      (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                       (Result *)in_stack_fffffffffffffde8);
          }
          Result::~Result((Result *)CONCAT44(uVar7,uVar3));
        }
        if ((*(uint *)(*(long *)(in_RDI + 0xe0) + 0x4c) & 1) == 0) {
          bVar1 = SenderBandwidthControl::ShouldSendProbe
                            ((SenderBandwidthControl *)CONCAT44(uVar7,uVar3),
                             in_stack_fffffffffffffdac);
          in_stack_fffffffffffffdac =
               CONCAT13((char)((uint)in_stack_fffffffffffffdac >> 0x18),
                        CONCAT12(bVar1,(short)in_stack_fffffffffffffdac));
          if (bVar1) {
            SessionOutgoing::PostRecovery
                      (in_stack_ffffffffffffff68,(int *)in_stack_ffffffffffffff60);
            bVar1 = CONCAT26(in_stack_fffffffffffffe36,local_1d0) != 0;
            in_stack_fffffffffffffdac =
                 CONCAT22((short)((uint)in_stack_fffffffffffffdac >> 0x10),
                          CONCAT11(bVar1,(char)in_stack_fffffffffffffdac));
            if (bVar1) {
              RefCounter::StartShutdown
                        (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                         (Result *)in_stack_fffffffffffffde8);
            }
            Result::~Result((Result *)CONCAT44(uVar7,uVar3));
          }
        }
        while( true ) {
          bVar1 = SenderBandwidthControl::ShouldSendProbe
                            ((SenderBandwidthControl *)CONCAT44(uVar7,uVar3),
                             in_stack_fffffffffffffdac);
          in_stack_fffffffffffffdac = CONCAT31((int3)((uint)in_stack_fffffffffffffdac >> 8),bVar1);
          if ((!bVar1) ||
             (bVar1 = SessionOutgoing::PostDummyDatagram(in_stack_fffffffffffffee0), !bVar1)) break;
          *(int *)(in_RDI + 0xc650) = *(int *)(in_RDI + 0xc650) + -0xa28;
        }
        local_100 = TickAgain;
        Result::~Result((Result *)CONCAT44(uVar7,uVar3));
      }
      else {
        bVar1 = std::atomic::operator_cast_to_bool
                          ((atomic<bool> *)
                           CONCAT17(in_stack_fffffffffffffdbf,
                                    CONCAT16(in_stack_fffffffffffffdbe,
                                             CONCAT24(in_stack_fffffffffffffdbc,
                                                      in_stack_fffffffffffffdb8))));
        if (bVar1) {
          bVar1 = Timer::IsExpired((Timer *)(in_RDI + 0xc808),local_110);
          if (bVar1) {
            SessionOutgoing::QueueUnreliable
                      (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
                       (uint8_t *)
                       CONCAT17(in_stack_fffffffffffffdbf,
                                CONCAT16(in_stack_fffffffffffffdbe,
                                         CONCAT24(in_stack_fffffffffffffdbc,
                                                  in_stack_fffffffffffffdb8))),
                       CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
            Result::~Result((Result *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0))
            ;
          }
          SessionOutgoing::Flush(in_stack_ffffffffffffff60);
          if (local_190 != 0) {
            RefCounter::StartShutdown
                      (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                       (Result *)in_stack_fffffffffffffde8);
          }
          local_100 = TickAgain;
          Result::~Result((Result *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        }
        else {
          local_100 = TickAgain;
        }
      }
    }
  }
  return local_100;
}

Assistant:

Connection::TimerTickResult Connection::onTimerTick()
{
    const uint64_t nowUsec = GetTicksUsec();

#ifdef TONK_DETAILED_STATS
    // Cycle the detail statistics
    Deets.NextWrite();
    Deets.GetWritePtr()->TimestampUsec = nowUsec;
#endif // TONK_DETAILED_STATS

    // If the TonkConnection's parent TonkSocket is shut down:
    if (Deps.SocketRefCount->IsShutdown())
    {
        SelfRefCount.StartShutdown(
            Tonk_AppRequest,
            Result("Connection::onTimerTick", "App shutdown in progress", ErrorType::Tonk, Tonk_AppRequest));
    }

    // If this TonkConnection is disconnected:
    if (SelfRefCount.IsShutdown()) {
        return onDiscoTimerTick();
    }

    // If no data has been received for too long:
    if (NoDataTimer.IsExpired(nowUsec))
    {
        SelfRefCount.StartShutdown(
            Tonk_RemoteTimeout,
            Result("Connection::onTimerTick", "No data from peer (Connection timeout)"));
        return TimerTickResult::TickAgain;
    }

    // If peer should be sending acks but none are received:
    if (!Outgoing.PeerCaughtUp() &&
        Outgoing.GetLastAckReceiveUsec() != 0 &&
        (int64_t)(nowUsec - Outgoing.GetLastAckReceiveUsec() - protocol::kNoAckSquelchTimeoutUsec) > 0)
    {
        // Squelch sender
        SenderControl.Squelch();

        if (RemoteAssignedIdForLocalHost != TONK_INVALID_ID)
        {
            // In case this is a mobile hand-off, start sending source address update tags
            Outgoing.StartHandshakeC2SUpdateSourceAddress(
                EncryptionKey,
                RemoteAssignedIdForLocalHost);
        }
    }

    // Update bandwidth control
    SenderControl.RecalculateAvailableBytes(nowUsec);
    ReceiverControl.UpdateSendShape(nowUsec, CachedReceiverStats.TripUsec);

    // Update NAT external mapped port
    if (Deps.MappedPort)
    {
        const uint16_t externalMappedPort = Deps.MappedPort->ExternalMappedPort;
        if (LocalNATMapExternalPort != externalMappedPort)
        {
            LocalNATMapExternalPort = externalMappedPort;
            sendNATMapPortToPeer(externalMappedPort);
        }
    }

    // If connection is not established yet:
    if (!ConnectionEstablished)
    {
        // If there is no peer address yet, wait longer
        if (!Outgoing.IsPeerAddressValid()) {
            return TimerTickResult::TickAgain;
        }

        // If it is time to run time sync but no session is established:
        if (TimeSyncTimer.IsExpired(nowUsec))
        {
            /*
                Each outgoing datagram will have a handshake footer attached, so
                this code path just needs to make sure there is at least one
                message to send, and to flush datagrams
            */

            // Send a 0-byte padding message frame
            Outgoing.QueueUnreliable(protocol::MessageType_Padding, nullptr, 0);
        }

        // Flush all queued data
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        // Send at least one packet
        Result flushResult = Outgoing.Flush();
        if (flushResult.IsFail()) {
            SelfRefCount.StartShutdown(Tonk_Error, flushResult);
        }

        return TimerTickResult::TickAgain;
    }

    // Post retransmits up to the protocol limit before adding more data
    for (unsigned i = 0; i < protocol::kRetransmitLimit; ++i)
    {
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        bool messageSent = false;
        Result retransmitResult = Outgoing.PostRetransmit(messageSent);

        if (retransmitResult.IsFail())
        {
            SelfRefCount.StartShutdown(Tonk_Error, retransmitResult);
            return TimerTickResult::TickAgain;
        }

        if (!messageSent) {
            break;
        }
    }

    /*
        TBD: Should application OnTick() and other things be running from an
        Asio green thread instead of blocking the rest of the code here?
        If the application significantly stalls the timer tick, for example,
        then it may cause inefficient use of the network.  And if the OnData()
        callback is called from a background thread then it would allow us
        to process FEC data in parallel.  Benchmarking needed here.
    */

    // If it is time to send a time sync message:
    if (TimeSyncTimer.IsExpired(nowUsec)) {
        onTimeSyncSendTimer();
    }

    /*
        This will emit a new acknowledgement either on a regular timer,
        or when the receiver bandwidth controller wants to emit a new
        rate control message for the sender to use.

        TBD: Should we gate this also on whether or not an acknowledgement
        might be needed?  Currently not because I do not want to decrease
        the rate at which we send bandwidth shape updates.
    */
    if (AcknowledgementTimer.IsExpired(nowUsec) ||
        (ReceiverControl.GetShouldAckFast()
         /* && Incoming.IsAckRequired() */))
    {
        onAckSendTimer(nowUsec);
    }

    // If it is time to invoke the application OnTick():
    if (AppTimer.IsExpired(nowUsec))
    {
        // Invoke application OnTick
        ConnectionConfig.OnTick(
            ConnectionConfig.AppContextPtr,
            reinterpret_cast<TonkConnection>(this),
            nowUsec);
    }

    // Flush all queued data
    TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
    Result flushResult = Outgoing.Flush();
    if (flushResult.IsFail()) {
        SelfRefCount.StartShutdown(Tonk_Error, flushResult);
    }

    //Logger.Info("this=", this, " AvailBytes = ", SenderControl.GetAvailableBytes(), " ProbeBytes = ", SenderControl.GetAvailableProbeBytes());

    // Calculate amount of recovery data we must send to protect data we've sent
    const unsigned recoveryCount = SenderControl.CalculateRecoverySendCount(nowUsec);
    int recoveryBytesSent = 0;
    for (unsigned i = 0; i < recoveryCount; ++i)
    {
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        tonk::Result result = Outgoing.PostRecovery(recoveryBytesSent);

        // If recovery packet was not sent:
        if (recoveryBytesSent == 0)
        {
            if (result.IsFail()) {
                SelfRefCount.StartShutdown(Tonk_FECFailed, result);
            }
            break; // Stop here
        }
    }

    // If FEC is enabled for probing bandwidth:
    if ((SocketConfig->Flags & TONK_FLAGS_DISABLE_FEC_BW_PROBES) == 0)
    {
        while (SenderControl.ShouldSendProbe(recoveryBytesSent))
        {
            // Note that recovery packets do not subtract from the bandwidth for
            // app data, but app data subtracts from bandwidth used for probing.

            TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
            tonk::Result result = Outgoing.PostRecovery(recoveryBytesSent);

            // If recovery packet was not sent:
            if (recoveryBytesSent == 0)
            {
                if (result.IsFail()) {
                    SelfRefCount.StartShutdown(Tonk_FECFailed, result);
                }
                break; // Stop here
            }

            SenderControl.SpendProbeBytes(recoveryBytesSent);
        }
    }

    // While there is available bandwidth for more probing:
    while (SenderControl.ShouldSendProbe(protocol::kDummyBytes))
    {
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        if (!Outgoing.PostDummyDatagram()) {
            break;
        }

        SenderControl.SpendProbeBytes(protocol::kDummyBytes);
    }

    return TimerTickResult::TickAgain;
}